

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O3

string * center(string *__return_storage_ptr__,string *str,int width)

{
  ostream *poVar1;
  int iVar2;
  uint uVar3;
  stringstream ss;
  stringstream spaces;
  long *local_380;
  long local_378;
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = width - (int)str->_M_string_length;
  if (1 < (int)uVar3) {
    iVar2 = (int)uVar3 / 2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_360,local_358)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_380,local_378);
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((uVar3 & 1) != 0 && 0 < (int)uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_330," ",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  return __return_storage_ptr__;
}

Assistant:

std::string center(const string& str, const int width) {
    stringstream ss, spaces;
    int padding = width - str.size();                 // count excess room to pad
    for (int i = 0; i < padding / 2; ++i)
        spaces << " ";
    ss << spaces.str() << str << spaces.str();    // format with padding
    if (padding > 0 && padding % 2 != 0)               // if odd #, add 1 space
        ss << " ";
    return ss.str();
}